

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O2

Translator * __thiscall
helics::ConnectorFederateManager::getTranslator(ConnectorFederateManager *this,string_view name)

{
  bool bVar1;
  handle trans;
  BlockIterator<helics::Translator,_32,_helics::Translator_**> tran;
  handle local_60;
  BlockIterator<helics::Translator,_32,_helics::Translator_**> local_48;
  const_iterator local_30;
  
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  ::lock(&local_60,&this->translators);
  gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>::find
            (&local_48,local_60.data,name);
  gmlc::containers::StableBlockVector<helics::Translator,_5U,_std::allocator<helics::Translator>_>::
  end(&local_30,&(local_60.data)->dataStorage);
  bVar1 = gmlc::containers::BlockIterator<helics::Translator,32,helics::Translator**>::operator!=
                    ((BlockIterator<helics::Translator,32,helics::Translator**> *)&local_48,
                     &local_30);
  if (!bVar1) {
    local_48.ptr = (Translator *)invalidTranNC;
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_60.m_handle_lock);
  return local_48.ptr;
}

Assistant:

Translator& ConnectorFederateManager::getTranslator(std::string_view name)
{
    auto trans = translators.lock();
    auto tran = trans->find(name);
    return (tran != trans.end()) ? (*tran) : invalidTranNC;
}